

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O2

string * __thiscall
spirv_cross::
join<char_const(&)[18],char_const(&)[2],std::__cxx11::string,char_const(&)[14],std::__cxx11::string,char_const(&)[2],char_const(&)[2],std::__cxx11::string,char_const(&)[6],unsigned_int&,char_const(&)[5],unsigned_int&,char_const(&)[3]>
          (string *__return_storage_ptr__,spirv_cross *this,char (*ts) [18],char (*ts_1) [2],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_2,char (*ts_3) [14],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_4,char (*ts_5) [2],
          char (*ts_6) [2],basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_7,
          char (*ts_8) [6],uint *ts_9,char (*ts_10) [5],uint *ts_11,char (*ts_12) [3])

{
  StringStream<4096UL,_4096UL> stream;
  StringStream<4096UL,_4096UL> local_1120;
  
  StringStream<4096UL,_4096UL>::StringStream(&local_1120);
  inner::
  join_helper<char_const(&)[18],char_const(&)[2],std::__cxx11::string,char_const(&)[14],std::__cxx11::string,char_const(&)[2],char_const(&)[2],std::__cxx11::string,char_const(&)[6],unsigned_int&,char_const(&)[5],unsigned_int&,char_const(&)[3]>
            (&local_1120,(char (*) [18])this,(char (*) [2])ts,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_1,
             (char (*) [14])ts_2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_3,
             (char (*) [2])ts_4,ts_5,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_6,
             (char (*) [6])ts_7,(uint *)ts_8,(char (*) [5])ts_9,(uint *)ts_10,(char (*) [3])ts_11);
  StringStream<4096ul,4096ul>::str_abi_cxx11_
            (__return_storage_ptr__,(StringStream<4096ul,4096ul> *)&local_1120);
  StringStream<4096UL,_4096UL>::~StringStream(&local_1120);
  return __return_storage_ptr__;
}

Assistant:

std::string join(Ts &&... ts)
{
	StringStream<> stream;
	inner::join_helper(stream, std::forward<Ts>(ts)...);
	return stream.str();
}